

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

Promise<kj::Maybe<capnp::MessageReaderAndFds>_>
capnp::tryReadMessage
          (AsyncCapabilityStream *input,ArrayPtr<kj::OwnFd> fdSpace,ReaderOptions options,
          ArrayPtr<capnp::word> scratchSpace)

{
  AsyncMessageReader *inputStream;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *other;
  word *pwVar1;
  size_t in_R9;
  ArrayPtr<capnp::word> scratchSpace_00;
  ArrayPtr<kj::OwnFd> fds;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> local_a8;
  int local_98;
  undefined4 uStack_94;
  word *pwStack_90;
  word *local_88;
  size_t sStack_80;
  int local_78;
  undefined4 uStack_74;
  word *pwStack_70;
  undefined1 local_50 [8];
  Promise<kj::Maybe<unsigned_long>_> promise;
  Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> reader;
  AsyncCapabilityStream *input_local;
  ReaderOptions options_local;
  ArrayPtr<kj::OwnFd> fdSpace_local;
  
  input_local = options._8_8_;
  pwVar1 = (word *)options.traversalLimitInWords;
  options_local._8_8_ = fdSpace.size_;
  options_local.traversalLimitInWords._0_4_ = (undefined4)in_R9;
  kj::heap<capnp::(anonymous_namespace)::AsyncMessageReader,capnp::ReaderOptions&>
            ((kj *)&promise,(ReaderOptions *)&input_local);
  inputStream = kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::
                operator->((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)
                           &promise);
  local_78 = options_local.nestingLimit;
  uStack_74 = options_local._12_4_;
  local_88 = scratchSpace.ptr;
  sStack_80 = scratchSpace.size_;
  scratchSpace_00.size_ = in_R9;
  scratchSpace_00.ptr = pwVar1;
  fds.size_ = options_local._8_8_;
  fds.ptr = fdSpace.ptr;
  pwStack_70 = pwVar1;
  anon_unknown_0::AsyncMessageReader::readWithFds
            ((AsyncMessageReader *)local_50,(AsyncCapabilityStream *)inputStream,fds,scratchSpace_00
            );
  other = kj::mv<kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,decltype(nullptr)>>
                    ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)
                     &promise);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::Own(&local_a8,other);
  local_98 = options_local.nestingLimit;
  uStack_94 = options_local._12_4_;
  pwStack_90 = pwVar1;
  kj::Promise<kj::Maybe<unsigned_long>>::
  then<capnp::tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)::__0>
            ((Promise<kj::Maybe<unsigned_long>> *)input,(Type *)local_50);
  tryReadMessage(kj::AsyncCapabilityStream&,kj::ArrayPtr<kj::OwnFd>,capnp::ReaderOptions,kj::ArrayPtr<capnp::word>)
  ::$_0::~__0((__0 *)&local_a8);
  kj::Promise<kj::Maybe<unsigned_long>_>::~Promise((Promise<kj::Maybe<unsigned_long>_> *)local_50);
  kj::Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t>::~Own
            ((Own<capnp::(anonymous_namespace)::AsyncMessageReader,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)input;
}

Assistant:

kj::Promise<kj::Maybe<MessageReaderAndFds>> tryReadMessage(
    kj::AsyncCapabilityStream& input, kj::ArrayPtr<kj::OwnFd> fdSpace,
    ReaderOptions options, kj::ArrayPtr<word> scratchSpace) {
  auto reader = kj::heap<AsyncMessageReader>(options);
  auto promise = reader->readWithFds(input, fdSpace, scratchSpace);
  return promise.then([reader = kj::mv(reader), fdSpace](kj::Maybe<size_t> nfds) mutable
                      -> kj::Maybe<MessageReaderAndFds> {
    KJ_IF_SOME(n, nfds) {
      return MessageReaderAndFds { kj::mv(reader), fdSpace.first(n) };
    } else {
      return kj::none;
    }
  });
}